

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O1

int luaZ_fill(ZIO *z)

{
  size_t in_RAX;
  byte *pbVar1;
  uint uVar2;
  size_t size;
  size_t local_18;
  
  local_18 = in_RAX;
  pbVar1 = (byte *)(*z->reader)(z->L,z->data,&local_18);
  uVar2 = 0xffffffff;
  if (local_18 != 0 && pbVar1 != (byte *)0x0) {
    z->n = local_18 - 1;
    z->p = (char *)(pbVar1 + 1);
    uVar2 = (uint)*pbVar1;
  }
  return uVar2;
}

Assistant:

int luaZ_fill (ZIO *z) {
  size_t size;
  lua_State *L = z->L;
  const char *buff;
  lua_unlock(L);
  buff = z->reader(L, z->data, &size);
  lua_lock(L);
  if (buff == NULL || size == 0)
    return EOZ;
  z->n = size - 1;  /* discount char being returned */
  z->p = buff;
  return cast_uchar(*(z->p++));
}